

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

void Abc_TgImplementPerm(Abc_TgMan_t *pMan,char *pPermDest)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = pMan->nVars;
  uVar2 = pMan->uPhase;
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar3) {
    uVar5 = (ulong)uVar3;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    pMan->pPermTRev[pMan->pPermT[uVar4]] = (char)uVar4;
  }
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    pMan->pPermT[uVar4] = pMan->pPermTRev[pPermDest[uVar4]];
  }
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    pMan->pPermTRev[pMan->pPermT[uVar4]] = (char)uVar4;
  }
  uVar2 = uVar2 & 1 << ((byte)uVar3 & 0x1f);
  Abc_TtImplementNpnConfig(pMan->pTruth,uVar3,pMan->pPermTRev,0);
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    uVar3 = 1 << ((byte)uVar4 & 0x1f);
    if ((pMan->uPhase >> ((byte)pMan->pPermT[uVar4] & 0x1f) & 1) == 0) {
      uVar3 = 0;
    }
    uVar2 = uVar2 | uVar3;
    cVar1 = pPermDest[uVar4];
    pMan->pPermT[uVar4] = cVar1;
    pMan->pPermTRev[cVar1] = (byte)uVar4;
  }
  pMan->uPhase = uVar2;
  return;
}

Assistant:

static void Abc_TgImplementPerm(Abc_TgMan_t* pMan, const char *pPermDest)
{
    int i, nVars = pMan->nVars;
    char *pPerm = pMan->pPermT;
    char *pRev = pMan->pPermTRev;
    unsigned uPhase = pMan->uPhase & (1 << nVars);

    for (i = 0; i < nVars; i++)
        pRev[(int)pPerm[i]] = i;
    for (i = 0; i < nVars; i++)
        pPerm[i] = pRev[(int)pPermDest[i]];
    for (i = 0; i < nVars; i++)
        pRev[(int)pPerm[i]] = i;

    Abc_TtImplementNpnConfig(pMan->pTruth, nVars, pRev, 0);
//  Abc_TtVerifySmallTruth(pMan->pTruth, nVars);

    for (i = 0; i < nVars; i++)
    {
        if (pMan->uPhase & (1 << pPerm[i]))
            uPhase |= (1 << i);
        pPerm[i] = pPermDest[i];
        pRev[(int)pPerm[i]] = i;
    }
    pMan->uPhase = uPhase;
}